

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyImages
               (TestLog *log,TestContext *testCtx,RenderContext *renderCtx,
               ConstPixelBufferAccess *testImage,ConstPixelBufferAccess *referenceImage)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  TestLog *this;
  bool bVar7;
  int iVar8;
  RGBA RVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  uint uVar12;
  size_t __n;
  ConstPixelBufferAccess *pCVar13;
  ulong uVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int kY;
  int iVar15;
  int kX;
  int y;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  allocator<char> local_29a;
  allocator<char> local_299;
  ulong local_298;
  int local_290;
  uint local_28c;
  ConstPixelBufferAccess *local_288;
  IVec4 threshold;
  ConstPixelBufferAccess local_240;
  TestLog *local_218;
  ulong local_210;
  ConstPixelBufferAccess *local_208;
  ulong local_200;
  IVec4 cTest;
  Surface diffMask;
  IVec4 cRef;
  
  local_288 = referenceImage;
  local_218 = log;
  tcu::Surface::Surface(&diffMask,(testImage->m_size).m_data[0],(testImage->m_size).m_data[1]);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&diffMask);
  uVar2 = (local_288->m_size).m_data[0];
  uVar3 = (local_288->m_size).m_data[1];
  iVar8 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  RVar9 = tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var,iVar8) + 8));
  cTest.m_data[3] = RVar9.m_value >> 0x18;
  __n = (size_t)(uint)cTest.m_data[3];
  cRef.m_data[3] = (uint)(0xffffff < RVar9.m_value) << 7;
  cRef.m_data[0] = 0x80;
  cRef.m_data[1] = 0x80;
  cRef.m_data[2] = 0x80;
  cTest.m_data[0] = RVar9.m_value & 0xff;
  cTest.m_data[1] = RVar9.m_value >> 8 & 0xff;
  cTest.m_data[2] = RVar9.m_value >> 0x10 & 0xff;
  tcu::operator+((tcu *)&threshold,&cRef,&cTest);
  tcu::clear((PixelBufferAccess *)&local_240,
             (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK);
  uVar4 = uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  uVar16 = (ulong)uVar4;
  uVar4 = uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = 0;
  }
  iVar8 = -1;
  local_290 = 0;
  uVar18 = 0;
  local_210 = uVar16;
  local_208 = testImage;
  while (uVar12 = (uint)uVar18, uVar12 != uVar4) {
    uVar10 = 1;
    if (1 < (int)uVar12) {
      uVar10 = uVar12;
    }
    uVar12 = uVar12 + 1;
    __n = (size_t)uVar12;
    uVar11 = uVar3 - 1;
    if ((int)uVar12 < (int)(uVar3 - 1)) {
      uVar11 = uVar12;
    }
    uVar14 = 0;
    local_200 = uVar18;
    while ((int)uVar14 != (int)uVar16) {
      local_298 = uVar14;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&cRef,(int)testImage,(int)uVar14,(int)uVar18);
      __n = uVar18 & 0xffffffff;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&cTest,(int)local_288,(int)local_298,(int)uVar18);
      bVar7 = compareThreshold(&cRef,&cTest,&threshold);
      iVar15 = (int)local_298;
      if (bVar7) {
        uVar14 = (ulong)(iVar15 + 1);
      }
      else {
        iVar6 = 1;
        if (1 < iVar15) {
          iVar6 = iVar15;
        }
        local_28c = iVar15 + 1;
        uVar5 = uVar2 - 1;
        if ((int)local_28c < (int)(uVar2 - 1)) {
          uVar5 = local_28c;
        }
        bVar17 = 0;
        for (iVar15 = uVar10 - 1; uVar18 = local_200, y = iVar6 + -1, iVar15 <= (int)uVar11;
            iVar15 = iVar15 + 1) {
          for (; y <= (int)uVar5; y = y + 1) {
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)&cTest,(int)local_288,y,iVar15);
            bVar7 = compareThreshold(&cRef,&cTest,&threshold);
            bVar17 = bVar17 | bVar7;
          }
        }
        if (bVar17 == 0) {
          __n = local_200 & 0xffffffff;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_240,
                     (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,(int)local_298,
                     (int)local_200,0);
          local_290 = local_290 + 1;
          uVar14 = (ulong)local_28c;
          iVar8 = 1;
          uVar16 = local_210;
          testImage = local_208;
        }
        else {
          __n = local_200 & 0xffffffff;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_240,
                     (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_DEV,(int)local_298,
                     (int)local_200,0);
          if (iVar8 == -1) {
            iVar8 = 0;
          }
          uVar14 = (ulong)local_28c;
          uVar16 = local_210;
          testImage = local_208;
        }
      }
    }
    uVar18 = (ulong)uVar12;
  }
  poVar1 = (ostringstream *)(cRef.m_data + 2);
  cRef.m_data._0_8_ = local_218;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar15 = local_290;
  std::ostream::operator<<(poVar1,local_290);
  std::operator<<((ostream *)poVar1," faulty pixel(s) found.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&cRef,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  this = local_218;
  if (iVar8 != 1) {
    iVar15 = iVar8;
  }
  if (0x14 < iVar15) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"Images",(allocator<char> *)&cTest);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&threshold,"Image comparison",&local_29a);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&cRef,(string *)&local_240,(string *)&threshold);
    iVar8 = (int)this;
    tcu::LogImageSet::write((LogImageSet *)&cRef,iVar8,__buf,__n);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&cRef);
    std::__cxx11::string::~string((string *)&threshold);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"Test image",(allocator<char> *)&cTest);
    std::__cxx11::string::string<std::allocator<char>>((string *)&threshold,"Test image",&local_29a)
    ;
    tcu::LogImage::LogImage
              ((LogImage *)&cRef,(string *)&local_240,(string *)&threshold,testImage,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cRef,iVar8,__buf_00,(size_t)testImage);
    tcu::LogImage::~LogImage((LogImage *)&cRef);
    std::__cxx11::string::~string((string *)&threshold);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"Reference image",(allocator<char> *)&cTest);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&threshold,"Reference image",&local_29a);
    pCVar13 = local_288;
    tcu::LogImage::LogImage
              ((LogImage *)&cRef,(string *)&local_240,(string *)&threshold,local_288,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cRef,iVar8,__buf_01,(size_t)pCVar13);
    tcu::LogImage::~LogImage((LogImage *)&cRef);
    std::__cxx11::string::~string((string *)&threshold);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&threshold,"Difference mask",&local_29a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cTest,"Difference mask",&local_299);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&diffMask);
    pCVar13 = &local_240;
    tcu::LogImage::LogImage
              ((LogImage *)&cRef,(string *)&threshold,(string *)&cTest,pCVar13,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cRef,iVar8,__buf_02,(size_t)pCVar13);
    tcu::LogImage::~LogImage((LogImage *)&cRef);
    std::__cxx11::string::~string((string *)&cTest);
    std::__cxx11::string::~string((string *)&threshold);
    tcu::TestLog::endImageSet(this);
    poVar1 = (ostringstream *)(cRef.m_data + 2);
    cRef.m_data._0_8_ = this;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Got ");
    std::ostream::operator<<(poVar1,iVar15);
    std::operator<<((ostream *)poVar1," faulty pixel(s).");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&cRef,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&diffMask);
  return;
}

Assistant:

void verifyImages (tcu::TestLog& log, tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const tcu::ConstPixelBufferAccess& testImage, const tcu::ConstPixelBufferAccess& referenceImage)
{
	using tcu::TestLog;

	const int			kernelRadius		= 1;
	const int			faultyPixelLimit	= 20;
	int					faultyPixels;
	tcu::Surface		diffMask			(testImage.getWidth(), testImage.getHeight());

	faultyPixels = compareImages(log, renderCtx, referenceImage, testImage, diffMask.getAccess(), kernelRadius);

	if (faultyPixels > faultyPixelLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison");
		log << TestLog::Image("Test image", "Test image", testImage);
		log << TestLog::Image("Reference image", "Reference image", referenceImage);
		log << TestLog::Image("Difference mask", "Difference mask", diffMask.getAccess());
		log << TestLog::EndImageSet;

		log << tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}